

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void __thiscall google::protobuf::internal::LogMessage::Finish(LogMessage *this)

{
  FatalException *this_00;
  LogLevel LVar1;
  
  if (this->level_ == LOGLEVEL_DFATAL) {
    LVar1 = LOGLEVEL_DFATAL;
  }
  else {
    if (0 < log_silencer_count_) goto LAB_00345362;
    LVar1 = this->level_;
  }
  (*(code *)log_handler__abi_cxx11_)(LVar1,this->filename_,this->line_,&this->message_);
LAB_00345362:
  if (this->level_ != LOGLEVEL_DFATAL) {
    return;
  }
  this_00 = (FatalException *)__cxa_allocate_exception(0x38);
  FatalException::FatalException(this_00,this->filename_,this->line_,&this->message_);
  __cxa_throw(this_00,&FatalException::typeinfo,FatalException::~FatalException);
}

Assistant:

void LogMessage::Finish() {
  bool suppress = false;

  if (level_ != LOGLEVEL_FATAL) {
    suppress = log_silencer_count_ > 0;
  }

  if (!suppress) {
    log_handler_(level_, filename_, line_, message_);
  }

  if (level_ == LOGLEVEL_FATAL) {
#if PROTOBUF_USE_EXCEPTIONS
    throw FatalException(filename_, line_, message_);
#else
    abort();
#endif
  }
}